

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O0

int __thiscall ncnn::Padding::load_param(Padding *this,ParamDict *pd)

{
  int iVar1;
  ParamDict *in_RSI;
  long in_RDI;
  float fVar2;
  
  iVar1 = ParamDict::get(in_RSI,0,0);
  *(int *)(in_RDI + 0x80) = iVar1;
  iVar1 = ParamDict::get(in_RSI,1,0);
  *(int *)(in_RDI + 0x84) = iVar1;
  iVar1 = ParamDict::get(in_RSI,2,0);
  *(int *)(in_RDI + 0x88) = iVar1;
  iVar1 = ParamDict::get(in_RSI,3,0);
  *(int *)(in_RDI + 0x8c) = iVar1;
  iVar1 = ParamDict::get(in_RSI,4,0);
  *(int *)(in_RDI + 0x90) = iVar1;
  fVar2 = ParamDict::get(in_RSI,5,0.0);
  *(float *)(in_RDI + 0x94) = fVar2;
  if ((((*(int *)(in_RDI + 0x80) == -0xe9) && (*(int *)(in_RDI + 0x84) == -0xe9)) &&
      (*(int *)(in_RDI + 0x88) == -0xe9)) && (*(int *)(in_RDI + 0x8c) == -0xe9)) {
    *(undefined1 *)(in_RDI + 8) = 0;
  }
  return 0;
}

Assistant:

int Padding::load_param(const ParamDict& pd)
{
    top = pd.get(0, 0);
    bottom = pd.get(1, 0);
    left = pd.get(2, 0);
    right = pd.get(3, 0);
    type = pd.get(4, 0);
    value = pd.get(5, 0.f);

    if (top == -233 && bottom == -233 && left == -233 && right == -233)
    {
        one_blob_only = false;
    }

    return 0;
}